

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LFSR.hpp
# Opt level: O3

void __thiscall Numeric::LFSR<unsigned_int,_73728U>::LFSR(LFSR<unsigned_int,_73728U> *this)

{
  int iVar1;
  uint8_t *value_byte;
  LFSR<unsigned_int,_73728U> *pLVar2;
  size_t c;
  long lVar3;
  
  this->value_ = 0;
  lVar3 = 0;
  pLVar2 = this;
  do {
    do {
      iVar1 = rand();
      *(char *)&pLVar2->value_ = (char)((ulong)((long)iVar1 * 0x7f) / 0x7fffffff);
      lVar3 = lVar3 + 1;
      pLVar2 = (LFSR<unsigned_int,_73728U> *)((long)&pLVar2->value_ + 1);
    } while (lVar3 != 4);
    lVar3 = 0;
    pLVar2 = this;
  } while (this->value_ == 0);
  return;
}

Assistant:

constexpr LFSR() noexcept {
			// Randomise the value, ensuring it doesn't end up being 0;
			// don't set any top bits, in case this is a signed type.
			while(!value_) {
				uint8_t *value_byte = reinterpret_cast<uint8_t *>(&value_);
				for(size_t c = 0; c < sizeof(IntType); ++c) {
					*value_byte = uint8_t(uint64_t(rand()) * 127 / RAND_MAX);
					++value_byte;
				}
			}
		}